

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

int htmlElementAllowedHere(htmlElemDesc *parent,xmlChar *elt)

{
  xmlChar *str1;
  int iVar1;
  char **ppcVar2;
  
  if ((parent != (htmlElemDesc *)0x0 && elt != (xmlChar *)0x0) &&
     (ppcVar2 = parent->subelts, ppcVar2 != (char **)0x0)) {
    str1 = (xmlChar *)*ppcVar2;
    while (str1 != (xmlChar *)0x0) {
      ppcVar2 = ppcVar2 + 1;
      iVar1 = xmlStrcmp(str1,elt);
      if (iVar1 == 0) {
        return 1;
      }
      str1 = (xmlChar *)*ppcVar2;
    }
  }
  return 0;
}

Assistant:

int
htmlElementAllowedHere(const htmlElemDesc* parent, const xmlChar* elt) {
  const char** p ;

  if ( ! elt || ! parent || ! parent->subelts )
	return 0 ;

  for ( p = parent->subelts; *p; ++p )
    if ( !xmlStrcmp((const xmlChar *)*p, elt) )
      return 1 ;

  return 0 ;
}